

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int sqlite3Fts3Incrmerge(Fts3Table *p,int nMerge,int nMin)

{
  sqlite3_stmt *psVar1;
  sqlite3_int64 *psVar2;
  Blob *pBlob;
  Blob *pBlob_00;
  sqlite3_uint64 sVar3;
  Fts3MultiSegReader *pFVar4;
  bool bVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  int iVar10;
  void *pvVar11;
  Fts3SegReader **__s;
  char *pcVar12;
  sqlite3_uint64 sVar13;
  sqlite3_int64 sVar14;
  void *pvVar15;
  uint uVar16;
  undefined8 uVar17;
  int *piVar18;
  long *plVar19;
  int iVar20;
  undefined4 uVar21;
  long lVar22;
  int *piVar23;
  int *piVar24;
  sqlite3_stmt *psVar25;
  ulong uVar26;
  long lVar27;
  int *in_R8;
  char *pcVar28;
  ulong uVar29;
  char cVar30;
  Fts3SegReader *pSeg;
  bool bVar31;
  int local_184;
  int *local_180;
  char *aBlock_1;
  sqlite3_stmt *local_170;
  int nLeaf;
  char *local_160;
  int nHintSeg;
  undefined4 uStack_154;
  undefined8 uStack_150;
  char *local_140;
  int *local_138;
  char *local_130;
  sqlite3_stmt *local_128;
  char *aLeaf;
  int local_114;
  char *local_110;
  Blob local_108;
  sqlite3_uint64 local_f8;
  int local_ec;
  sqlite3_stmt *pSelect;
  undefined8 uStack_e0;
  sqlite3_int64 local_d8;
  char *local_d0;
  uint local_c8;
  long *local_b0;
  sqlite3_int64 iEnd;
  Fts3MultiSegReader *local_a0;
  sqlite3_uint64 local_98;
  int *local_90;
  sqlite3_int64 local_88;
  int local_7c;
  Blob *local_78;
  Blob *local_70;
  sqlite3_stmt *pFindLevel;
  size_t local_60;
  ulong local_58;
  int *local_50;
  Blob *local_48;
  int *local_40;
  Fts3SegFilter *local_38;
  
  local_108.a = (char *)0x0;
  local_108.n = 0;
  local_108.nAlloc = 0;
  local_ec = nMerge;
  local_180 = (int *)sqlite3_malloc(0x328);
  if (local_180 == (int *)0x0) {
    iVar6 = 7;
  }
  else {
    pSelect = (sqlite3_stmt *)0x0;
    local_108._8_8_ = local_108._8_8_ & 0xffffffff00000000;
    iVar6 = fts3SqlStmt(p,0x16,&pSelect,(sqlite3_value **)0x0);
    psVar25 = pSelect;
    _nHintSeg = (sqlite3_stmt *)CONCAT44(uStack_154,iVar6);
    if (iVar6 == 0) {
      sqlite3_bind_int64(pSelect,1,1);
      iVar6 = sqlite3_step(psVar25);
      bVar31 = true;
      iVar20 = 0;
      if (iVar6 == 100) {
        pvVar11 = sqlite3_column_blob(psVar25,0);
        iVar6 = sqlite3_column_bytes(psVar25,0);
        iVar20 = 0;
        if (pvVar11 != (void *)0x0) {
          blobGrowBuffer(&local_108,iVar6,&nHintSeg);
          bVar31 = false;
          iVar20 = nHintSeg;
          if (nHintSeg == 0) {
            memcpy(local_108.a,pvVar11,(long)iVar6);
            local_108.n = iVar6;
            iVar20 = 0;
            bVar31 = true;
          }
        }
      }
      iVar6 = sqlite3_reset(psVar25);
      if (!bVar31) {
        iVar6 = iVar20;
      }
    }
    local_38 = (Fts3SegFilter *)(local_180 + 0xae);
    if (nMin < 3) {
      nMin = 2;
    }
    local_a0 = (Fts3MultiSegReader *)(local_180 + 0xb4);
    local_138 = local_180 + 0xe;
    local_b0 = (long *)(local_180 + 10);
    local_48 = (Blob *)(local_180 + 0x10);
    local_70 = (Blob *)(local_180 + 0x14);
    local_78 = (Blob *)(local_180 + 0x1e);
    local_50 = local_180 + 0x18;
    local_40 = local_180 + 0x1a;
    local_114 = 0;
    local_170 = (sqlite3_stmt *)0x0;
    piVar24 = local_180;
    local_7c = nMin;
    while ((iVar6 == 0 && (0 < local_ec))) {
      iVar6 = p->nIndex;
      pFindLevel = (sqlite3_stmt *)0x0;
      fts3SqlStmt(p,0x1c,&pFindLevel,(sqlite3_value **)0x0);
      psVar25 = pFindLevel;
      sqlite3_bind_int(pFindLevel,1,local_7c);
      iVar7 = sqlite3_step(psVar25);
      iVar20 = -1;
      if (iVar7 == 100) {
        local_170 = (sqlite3_stmt *)sqlite3_column_int64(psVar25,0);
        iVar20 = sqlite3_column_int(psVar25,1);
      }
      local_184 = sqlite3_reset(psVar25);
      pcVar28 = local_108.a;
      iVar7 = local_108.n;
      if (local_108.n == 0 || local_184 != 0) {
LAB_001aaaaf:
        uVar26 = 0;
      }
      else {
        lVar22 = (long)iVar6 << 10;
        pSelect = (sqlite3_stmt *)0x0;
        _nHintSeg = (sqlite3_stmt *)((ulong)_nHintSeg & 0xffffffff00000000);
        uVar16 = local_108.n - 2;
        uVar8 = (int)uVar16 >> 0x1f & uVar16;
        while ((uVar9 = uVar8, 0 < (int)uVar16 &&
               (uVar9 = uVar16, local_108.a[(ulong)uVar16 - 1] < '\0'))) {
          uVar16 = uVar16 - 1;
        }
        uVar16 = (int)uVar9 >> 0x1f & uVar9;
        while ((uVar8 = uVar16, 0 < (int)uVar9 &&
               (uVar8 = uVar9, local_108.a[(ulong)uVar9 - 1] < '\0'))) {
          uVar9 = uVar9 - 1;
        }
        local_108.n = uVar8;
        iVar6 = sqlite3Fts3GetVarint(local_108.a + (int)uVar8,(sqlite_int64 *)&pSelect);
        iVar6 = uVar8 + iVar6;
        cVar30 = pcVar28[iVar6];
        if (cVar30 < '\0') {
          iVar10 = sqlite3Fts3GetVarint32(pcVar28 + iVar6,&nHintSeg);
        }
        else {
          _nHintSeg = (sqlite3_stmt *)CONCAT44(uStack_154,(int)cVar30);
          iVar10 = 1;
        }
        local_184 = 0x10b;
        if (iVar10 + iVar6 == iVar7) {
          local_184 = 0;
        }
        if ((-1 < iVar20) && ((long)local_170 % lVar22 < (long)pSelect % lVar22)) {
          local_108._8_8_ = CONCAT44(local_108.nAlloc,iVar7);
          goto LAB_001aaaaf;
        }
        uVar26 = CONCAT71((int7)((ulong)lVar22 >> 8),1);
        local_114 = 1;
        local_170 = pSelect;
        iVar20 = nHintSeg;
      }
      piVar24 = local_180;
      iVar6 = local_184;
      if (iVar20 < 0) break;
      local_110 = (char *)CONCAT44(local_110._4_4_,iVar20);
      memset(local_180,0,0x328);
      piVar24[0xb2] = 1;
      iVar20 = local_184;
      if (iVar6 == 0) {
        pSelect = (sqlite3_stmt *)0x0;
        sVar13 = 0;
        iVar20 = fts3SqlStmt(p,8,&pSelect,(sqlite3_value **)0x0);
        psVar25 = pSelect;
        if (iVar20 == 0) {
          sqlite3_bind_int64(pSelect,1,(sqlite_int64)(local_170 + 1));
          sqlite3_step(psVar25);
          uVar16 = sqlite3_column_int(psVar25,0);
          sVar13 = (sqlite3_uint64)uVar16;
          iVar20 = sqlite3_reset(psVar25);
        }
        uVar21 = (undefined4)(uVar26 ^ 1);
        if (((int)sVar13 != 0 & ((int)sVar13 != 1 | (byte)(uVar26 ^ 1))) == 0) {
          local_184 = iVar20;
          iVar20 = fts3SqlStmt(p,0xf,&pSelect,(sqlite3_value **)0x0);
          psVar25 = pSelect;
          iVar6 = iVar20;
          if (iVar20 != 0) goto LAB_001aacd0;
          local_140 = (char *)CONCAT44(local_140._4_4_,uVar21);
          psVar1 = local_170 + 1;
          sqlite3_bind_int64(pSelect,1,(sqlite_int64)(local_170 + 2));
          sqlite3_bind_int64(psVar25,2,((long)psVar1 / 0x400) * 0x400 + 0x400);
          iVar6 = sqlite3_step(psVar25);
          bVar31 = true;
          if (iVar6 == 100) {
            iVar6 = sqlite3_column_type(psVar25,0);
            bVar31 = iVar6 != 5;
          }
          iVar20 = sqlite3_reset(psVar25);
          if (!bVar31) {
            *(byte *)(piVar24 + 0xb2) = *(byte *)(piVar24 + 0xb2) | 2;
          }
          uVar21 = (int)local_140;
        }
        pFVar4 = local_a0;
        iVar6 = iVar20;
        if (iVar20 == 0) {
          local_140 = (char *)CONCAT44(local_140._4_4_,uVar21);
          pSelect = (sqlite3_stmt *)0x0;
          *(undefined8 *)&local_a0->nTerm = 0;
          local_a0->aDoclist = (char *)0x0;
          *(undefined8 *)&local_a0->bLookup = 0;
          local_a0->zTerm = (char *)0x0;
          local_a0->nBuffer = 0;
          local_a0->iColFilter = 0;
          local_a0->bRestart = 0;
          local_a0->nCost = 0;
          *(undefined8 *)&local_a0->nDoclist = 0;
          local_a0->pFilter = (Fts3SegFilter *)0x0;
          local_a0->aBuffer = (char *)0x0;
          local_a0->apSegment = (Fts3SegReader **)0x0;
          local_a0->nSegment = 0;
          local_a0->nAdvance = 0;
          local_130 = (char *)((ulong)local_110 & 0xffffffff);
          sVar3 = (long)local_130 * 8;
          local_184 = iVar20;
          __s = (Fts3SegReader **)sqlite3_malloc64(sVar3);
          pFVar4->apSegment = __s;
          iVar20 = 7;
          iVar6 = 7;
          if (__s != (Fts3SegReader **)0x0) {
            memset(__s,0,sVar3);
            iVar20 = fts3SqlStmt(p,0xc,&pSelect,(sqlite3_value **)0x0);
            psVar25 = pSelect;
            iVar6 = iVar20;
            if (iVar20 == 0) {
              local_f8 = sVar13;
              sqlite3_bind_int64(pSelect,1,(sqlite_int64)local_170);
              lVar22 = 0;
              iVar6 = 0;
              for (pcVar28 = (char *)0x0;
                  ((iVar6 == 0 && (iVar20 = sqlite3_step(psVar25), iVar20 == 100)) &&
                  (pcVar28 < local_130)); pcVar28 = pcVar28 + 1) {
                local_160 = (char *)sqlite3_column_int64(psVar25,1);
                local_128 = (sqlite3_stmt *)sqlite3_column_int64(psVar25,2);
                in_R8 = (int *)sqlite3_column_int64(psVar25,3);
                pcVar12 = (char *)sqlite3_column_blob(psVar25,4);
                iVar6 = sqlite3_column_bytes(psVar25,4);
                piVar24 = local_180;
                iVar6 = sqlite3Fts3SegReaderNew
                                  ((int)pcVar28,0,(sqlite3_int64)local_160,(sqlite3_int64)local_128,
                                   (sqlite3_int64)in_R8,pcVar12,iVar6,
                                   (Fts3SegReader **)(*(long *)(local_180 + 0xb4) + lVar22));
                piVar24[0xb6] = piVar24[0xb6] + 1;
                lVar22 = lVar22 + 8;
              }
              local_184 = sqlite3_reset(psVar25);
              pFVar4 = local_a0;
              sVar13 = local_f8;
              piVar24 = local_180;
              if (iVar6 != 0) {
                local_184 = iVar6;
              }
              iVar20 = local_184;
              iVar6 = local_184;
              if (local_184 == 0) {
                iVar6 = 0;
                if (((local_180[0xb6] == (int)local_110) &&
                    (local_184 = sqlite3Fts3SegReaderStart(p,local_a0,local_38), iVar20 = local_184,
                    iVar6 = local_184, local_184 == 0)) &&
                   (local_184 = sqlite3Fts3SegReaderStep(p,pFVar4), iVar20 = local_184,
                   iVar6 = local_184, local_184 == 100)) {
                  if ((char)local_140 == '\0' && 0 < (int)sVar13) {
                    local_160 = *(char **)(piVar24 + 0xc2);
                    iVar6 = piVar24[0xc4];
                    _nHintSeg = (sqlite3_stmt *)0x0;
                    piVar18 = (int *)0x0;
                    iVar20 = fts3SqlStmt(p,0x20,(sqlite3_stmt **)&nHintSeg,(sqlite3_value **)0x0);
                    psVar25 = _nHintSeg;
                    if (iVar20 == 0) {
                      local_130 = (char *)CONCAT44(local_130._4_4_,iVar6);
                      iEnd = 0;
                      iVar20 = (int)sVar13 + -1;
                      sqlite3_bind_int64(_nHintSeg,1,(sqlite_int64)(local_170 + 1));
                      sqlite3_bind_int(psVar25,2,iVar20);
                      iVar6 = sqlite3_step(psVar25);
                      if (iVar6 == 100) {
                        sVar13 = sqlite3_column_int64(psVar25,1);
                        local_88 = sqlite3_column_int64(psVar25,2);
                        plVar19 = local_b0;
                        local_128 = psVar25;
                        fts3ReadEndBlockField(psVar25,3,&iEnd,local_b0);
                        psVar25 = local_128;
                        lVar22 = *plVar19;
                        if (lVar22 < 0) {
                          *local_b0 = -lVar22;
                          lVar22 = 1;
                        }
                        *(bool *)(piVar24 + 0xc) = lVar22 == 0;
                        local_f8 = sVar13;
                        iVar6 = sqlite3_column_bytes(local_128,4);
                        local_98 = CONCAT44(local_98._4_4_,iVar6);
                        local_140 = (char *)sqlite3_column_blob(psVar25,4);
                        piVar23 = (int *)iEnd;
                        pSelect = (sqlite3_stmt *)0x0;
                        bVar31 = false;
                        uVar17 = 0;
                        iVar6 = fts3SqlStmt(p,0x22,&pSelect,(sqlite3_value **)0x0);
                        psVar25 = pSelect;
                        if (iVar6 == 0) {
                          sqlite3_bind_int64(pSelect,1,(sqlite_int64)piVar23);
                          iVar6 = sqlite3_step(psVar25);
                          bVar31 = iVar6 == 100;
                          iVar6 = sqlite3_reset(psVar25);
                        }
                        aBlock_1 = (char *)CONCAT44(aBlock_1._4_4_,iVar6);
                        piVar18 = (int *)CONCAT71((int7)((ulong)uVar17 >> 8),bVar31);
                        if (iVar6 == 0 && bVar31) {
                          local_90 = piVar23;
                          aLeaf = (char *)0x0;
                          nLeaf = 0;
                          piVar18 = &nLeaf;
                          iVar6 = sqlite3Fts3ReadBlock(p,local_88,&aLeaf,piVar18,in_R8);
                          aBlock_1 = (char *)CONCAT44(aBlock_1._4_4_,iVar6);
                          bVar5 = true;
                          if (iVar6 == 0) {
                            iVar6 = nodeReaderInit((NodeReader *)&pSelect,aLeaf,nLeaf);
                            iVar7 = (int)local_130;
                            while ((pcVar28 = local_d0, iVar6 == 0 &&
                                   (pSelect != (sqlite3_stmt *)0x0))) {
                              iVar6 = nodeReaderNext((NodeReader *)&pSelect);
                            }
                            aBlock_1 = (char *)CONCAT44(aBlock_1._4_4_,iVar6);
                            piVar18 = (int *)(ulong)local_c8;
                            iVar7 = fts3TermCmp(local_160,iVar7,local_d0,local_c8);
                            if (iVar7 < 1) {
                              bVar31 = false;
                            }
                            sqlite3_free(pcVar28);
                            bVar5 = bVar31;
                          }
                          bVar31 = bVar5;
                          sqlite3_free(aLeaf);
                          piVar23 = local_90;
                        }
                        if ((iVar6 == 0) && (bVar31)) {
                          cVar30 = *local_140;
                          uVar29 = (ulong)cVar30;
                          iVar6 = (((int)piVar23 - (int)local_f8) + 1) / 0x10;
                          *piVar24 = iVar6;
                          *(sqlite3_uint64 *)(piVar24 + 6) = local_f8;
                          *(int **)(piVar24 + 8) = piVar23;
                          *(sqlite3_stmt **)(piVar24 + 2) = local_170;
                          piVar24[4] = iVar20;
                          piVar18 = (int *)(long)iVar6;
                          plVar19 = (long *)(local_50 + uVar29 * 10);
                          lVar22 = (uVar29 + 1) * (long)piVar18 + local_f8;
                          iVar20 = (int)local_98;
                          for (uVar26 = uVar29; (long)uVar26 < 0xf; uVar26 = uVar26 + 1) {
                            *plVar19 = lVar22;
                            plVar19 = plVar19 + 5;
                            lVar22 = lVar22 + (long)piVar18;
                          }
                          in_R8 = (int *)(local_f8 + (long)(iVar6 * cVar30));
                          *(int **)(local_138 + uVar29 * 10) = in_R8;
                          iVar6 = p->nNodeSize;
                          if (p->nNodeSize < (int)local_98) {
                            iVar6 = (int)local_98;
                          }
                          blobGrowBuffer((Blob *)(local_138 + uVar29 * 10 + 6),iVar6,
                                         (int *)&aBlock_1);
                          piVar23 = local_138;
                          iVar6 = (int)aBlock_1;
                          if ((int)aBlock_1 == 0) {
                            memcpy(*(void **)(local_138 + uVar29 * 10 + 6),local_140,(long)iVar20);
                            piVar23[uVar29 * 10 + 8] = iVar20;
                          }
                          while ((piVar23 = local_138, iVar6 == 0 &&
                                 (iVar20 = (int)uVar29, -1 < iVar20))) {
                            uVar29 = uVar29 & 0xffffffff;
                            piVar18 = local_138;
                            iVar6 = nodeReaderInit((NodeReader *)&pSelect,
                                                   *(char **)(local_138 + uVar29 * 10 + 6),
                                                   local_138[uVar29 * 10 + 8]);
                            while ((uVar16 = local_c8, pSelect != (sqlite3_stmt *)0x0 &&
                                   (iVar6 == 0))) {
                              iVar6 = nodeReaderNext((NodeReader *)&pSelect);
                            }
                            aBlock_1 = (char *)CONCAT44(aBlock_1._4_4_,iVar6);
                            blobGrowBuffer((Blob *)(piVar23 + uVar29 * 10 + 2),local_c8,
                                           (int *)&aBlock_1);
                            pcVar28 = local_d0;
                            iVar6 = (int)aBlock_1;
                            if ((int)aBlock_1 == 0) {
                              memcpy(*(void **)(piVar23 + uVar29 * 10 + 2),local_d0,
                                     (long)(int)uVar16);
                              piVar23[uVar29 * 10 + 4] = uVar16;
                              if (iVar20 < 1) {
                                iVar6 = 0;
                              }
                              else {
                                aLeaf = (char *)0x0;
                                nLeaf = 0;
                                uVar26 = (ulong)(iVar20 - 1);
                                psVar2 = (sqlite3_int64 *)(local_138 + uVar26 * 10);
                                *psVar2 = local_d8;
                                piVar18 = &nLeaf;
                                iVar6 = sqlite3Fts3ReadBlock(p,local_d8,&aLeaf,piVar18,in_R8);
                                iVar7 = nLeaf;
                                aBlock_1 = (char *)CONCAT44(aBlock_1._4_4_,iVar6);
                                iVar6 = p->nNodeSize;
                                if (p->nNodeSize < nLeaf) {
                                  iVar6 = nLeaf;
                                }
                                blobGrowBuffer((Blob *)(psVar2 + 3),iVar6,(int *)&aBlock_1);
                                piVar24 = local_138;
                                iVar6 = (int)aBlock_1;
                                if ((int)aBlock_1 == 0) {
                                  memcpy(*(void **)(local_138 + uVar26 * 10 + 6),aLeaf,(long)iVar7);
                                  piVar24[uVar26 * 10 + 8] = iVar7;
                                }
                                sqlite3_free(aLeaf);
                                piVar24 = local_180;
                              }
                            }
                            sqlite3_free(pcVar28);
                            uVar29 = (ulong)(iVar20 - 1);
                          }
                        }
                        iVar20 = sqlite3_reset(local_128);
                        if (iVar6 != 0) {
                          iVar20 = iVar6;
                        }
                      }
                      else {
                        iVar20 = sqlite3_reset(psVar25);
                      }
                    }
                  }
                  else {
                    pSelect = (sqlite3_stmt *)0x0;
                    _nHintSeg = (sqlite3_stmt *)0x0;
                    piVar18 = (int *)0x0;
                    iVar20 = fts3SqlStmt(p,0x1d,&pSelect,(sqlite3_value **)0x0);
                    psVar25 = pSelect;
                    if (iVar20 == 0) {
                      sqlite3_bind_int64(pSelect,1,(sqlite_int64)local_170);
                      sqlite3_bind_int64(psVar25,2,(long)piVar24[0xb6]);
                      iVar6 = sqlite3_step(psVar25);
                      iVar7 = 0;
                      if (iVar6 == 100) {
                        iVar7 = sqlite3_column_int(psVar25,0);
                      }
                      iVar20 = sqlite3_reset(psVar25);
                      if (iVar20 == 0) {
                        piVar18 = (int *)0x0;
                        iVar20 = fts3SqlStmt(p,10,(sqlite3_stmt **)&nHintSeg,(sqlite3_value **)0x0);
                        psVar25 = _nHintSeg;
                        if (iVar20 == 0) {
                          iVar6 = sqlite3_step(_nHintSeg);
                          if (iVar6 == 100) {
                            sVar14 = sqlite3_column_int64(psVar25,0);
                            *(sqlite3_int64 *)(piVar24 + 6) = sVar14;
                            piVar18 = (int *)(long)(iVar7 << 4);
                            *(long *)(piVar24 + 8) = (long)piVar18 + sVar14 + -1;
                          }
                          iVar20 = sqlite3_reset(psVar25);
                          if (iVar20 == 0) {
                            piVar18 = (int *)0x0;
                            iVar20 = fts3WriteSegment(p,*(sqlite3_int64 *)(piVar24 + 8),(char *)0x0,
                                                      0);
                            if (iVar20 == 0) {
                              *(sqlite3_stmt **)(piVar24 + 2) = local_170;
                              *piVar24 = iVar7;
                              piVar24[4] = (int)local_f8;
                              lVar22 = *(long *)(piVar24 + 6);
                              piVar18 = (int *)(long)iVar7;
                              for (lVar27 = 0x38; lVar27 != 0x2b8; lVar27 = lVar27 + 0x28) {
                                *(long *)((long)piVar24 + lVar27) = lVar22;
                                lVar22 = lVar22 + (long)piVar18;
                              }
                              iVar20 = 0;
                            }
                          }
                        }
                      }
                    }
                  }
                  local_184 = iVar20;
                  iVar6 = iVar20;
                  if (iVar20 == 0) {
                    local_184 = 0;
                    if (*piVar24 == 0) {
                      iVar6 = 0;
                      local_184 = iVar20;
                      goto LAB_001ab435;
                    }
                    do {
                      local_130 = *(char **)(piVar24 + 0xc2);
                      piVar23 = *(int **)(piVar24 + 0xc6);
                      iVar6 = piVar24[0xc4];
                      iVar20 = piVar24[200];
                      _nHintSeg = (sqlite3_stmt *)((ulong)_nHintSeg & 0xffffffff00000000);
                      iVar7 = fts3PrefixCompress(*(char **)(piVar24 + 0x10),piVar24[0x12],local_130,
                                                 (int)piVar18);
                      local_160 = (char *)CONCAT44(local_160._4_4_,iVar7);
                      sVar13 = (long)iVar6 - (long)iVar7;
                      local_98 = (long)iVar6;
                      iVar6 = sqlite3Fts3VarintLen((long)iVar7);
                      iVar7 = sqlite3Fts3VarintLen(sVar13);
                      iVar10 = sqlite3Fts3VarintLen((long)iVar20);
                      piVar24 = local_180;
                      local_88 = CONCAT44(local_88._4_4_,iVar20);
                      iVar7 = iVar6 + (int)sVar13 + iVar7 + iVar10 + iVar20;
                      iVar6 = local_180[0x16];
                      if ((0 < iVar6) && (p->nNodeSize < iVar7 + iVar6)) {
                        local_90 = piVar23;
                        local_58 = (ulong)(uint)(iVar10 + iVar20);
                        iVar6 = fts3WriteSegment(p,*(sqlite3_int64 *)(local_180 + 0xe),
                                                 *(char **)(local_180 + 0x14),iVar6);
                        _nHintSeg = (sqlite3_stmt *)CONCAT44(uStack_154,iVar6);
                        piVar24[1] = piVar24[1] + 1;
                        pcVar28 = *(char **)(piVar24 + 0xe);
                        if (iVar6 == 0) {
                          iVar6 = (int)local_160 + 1;
                          local_160 = (char *)CONCAT44(local_160._4_4_,iVar6);
                          local_60 = (size_t)iVar6;
                          cVar30 = '\x01';
                          lVar22 = 0;
                          piVar24 = local_138;
                          do {
                            piVar18 = local_180;
                            if (lVar22 == 600) {
                              iVar6 = 0;
                              break;
                            }
                            local_128 = (sqlite3_stmt *)CONCAT71(local_128._1_7_,cVar30);
                            pSelect = (sqlite3_stmt *)((ulong)pSelect & 0xffffffff00000000);
                            iVar6 = *(int *)((long)local_180 + lVar22 + 0x70);
                            local_140 = pcVar28;
                            iVar20 = fts3PrefixCompress(*(char **)((long)local_180 + lVar22 + 0x68),
                                                        iVar6,local_130,(int)pcVar28);
                            iVar10 = (int)local_160 - iVar20;
                            local_f8 = (sqlite3_uint64)iVar20;
                            iVar7 = sqlite3Fts3VarintLen(local_f8);
                            sVar13 = (sqlite3_uint64)iVar10;
                            iVar20 = sqlite3Fts3VarintLen(sVar13);
                            piVar23 = local_180;
                            iVar7 = iVar20 + iVar10 + iVar7;
                            iVar20 = *(int *)((long)piVar18 + lVar22 + 0x80);
                            if ((iVar6 == 0) || (iVar20 + iVar7 <= p->nNodeSize)) {
                              pBlob = (Blob *)((long)&local_78->a + lVar22);
                              if (iVar20 == 0) {
                                blobGrowBuffer(pBlob,p->nNodeSize,(int *)&pSelect);
                                piVar24 = local_180;
                                if ((int)pSelect == 0) {
                                  **(undefined1 **)((long)local_180 + lVar22 + 0x78) =
                                       (char)local_128;
                                  iVar20 = sqlite3Fts3PutVarint
                                                     ((char *)(*(long *)((long)local_180 +
                                                                        lVar22 + 0x78) + 1),
                                                      (sqlite_int64)local_140);
                                  iVar20 = iVar20 + 1;
                                  *(int *)((long)piVar24 + lVar22 + 0x80) = iVar20;
                                }
                                else {
                                  iVar20 = *(int *)((long)local_180 + lVar22 + 0x80);
                                }
                              }
                              pBlob_00 = (Blob *)((long)local_40 + lVar22);
                              blobGrowBuffer(pBlob,iVar20 + iVar7,(int *)&pSelect);
                              blobGrowBuffer(pBlob_00,(int)local_160,(int *)&pSelect);
                              sVar3 = local_f8;
                              piVar24 = local_138;
                              piVar23 = local_180;
                              if ((int)pSelect == 0) {
                                iVar6 = *(int *)((long)local_180 + lVar22 + 0x80);
                                if (*(int *)((long)local_180 + lVar22 + 0x70) != 0) {
                                  iVar6 = sqlite3Fts3PutVarint
                                                    ((char *)((long)iVar6 +
                                                             *(long *)((long)local_180 +
                                                                      lVar22 + 0x78)),local_f8);
                                  iVar6 = iVar6 + *(int *)((long)piVar23 + lVar22 + 0x80);
                                  *(int *)((long)piVar23 + lVar22 + 0x80) = iVar6;
                                }
                                iVar6 = sqlite3Fts3PutVarint
                                                  ((char *)((long)iVar6 +
                                                           *(long *)((long)piVar23 + lVar22 + 0x78))
                                                   ,sVar13);
                                pcVar28 = local_130;
                                lVar27 = (long)iVar6 + (long)*(int *)((long)piVar23 + lVar22 + 0x80)
                                ;
                                *(int *)((long)piVar23 + lVar22 + 0x80) = (int)lVar27;
                                memcpy((void *)(lVar27 + *(long *)((long)piVar23 + lVar22 + 0x78)),
                                       local_130 + sVar3,sVar13);
                                piVar18 = (int *)((long)piVar23 + lVar22 + 0x80);
                                *piVar18 = *piVar18 + iVar10;
                                memcpy(*(void **)((long)piVar23 + lVar22 + 0x68),pcVar28,local_60);
                                iVar6 = 0;
                                pcVar28 = (char *)0x0;
                                uVar21 = (int)local_160;
                                cVar30 = (char)local_128;
                                goto LAB_001ab796;
                              }
                              pcVar28 = (char *)0x0;
                              cVar30 = (char)local_128;
                              iVar6 = (int)pSelect;
                            }
                            else {
                              iVar6 = fts3WriteSegment(p,*(sqlite3_int64 *)
                                                          ((long)local_180 + lVar22 + 0x60),
                                                       *(char **)((long)local_180 + lVar22 + 0x78),
                                                       iVar20);
                              cVar30 = (char)local_128;
                              **(char **)((long)piVar23 + lVar22 + 0x78) = (char)local_128;
                              iVar20 = sqlite3Fts3PutVarint
                                                 ((char *)(*(long *)((long)piVar23 + lVar22 + 0x78)
                                                          + 1),(sqlite_int64)(local_140 + 1));
                              *(int *)((long)piVar23 + lVar22 + 0x80) = iVar20 + 1;
                              pcVar28 = *(char **)((long)piVar23 + lVar22 + 0x60);
                              *(char **)((long)piVar23 + lVar22 + 0x60) = pcVar28 + 1;
                              piVar24 = local_138;
                              uVar21 = 0;
LAB_001ab796:
                              *(undefined4 *)((long)piVar23 + lVar22 + 0x70) = uVar21;
                            }
                            if (iVar6 != 0) break;
                            cVar30 = cVar30 + '\x01';
                            lVar22 = lVar22 + 0x28;
                          } while (pcVar28 != (char *)0x0);
                          _nHintSeg = (sqlite3_stmt *)CONCAT44(uStack_154,iVar6);
                          pcVar28 = *(char **)piVar24;
                          piVar24 = local_180;
                        }
                        sVar13 = local_98;
                        *(char **)(piVar24 + 0xe) = pcVar28 + 1;
                        piVar24[0x12] = 0;
                        piVar24[0x16] = 0;
                        iVar6 = sqlite3Fts3VarintLen(local_98);
                        iVar7 = iVar6 + (int)local_58 + (int)sVar13 + 1;
                        iVar6 = 0;
                        piVar23 = local_90;
                      }
                      *local_b0 = *local_b0 + (long)iVar7;
                      blobGrowBuffer(local_70,iVar7 + iVar6,&nHintSeg);
                      iVar6 = nHintSeg;
                      if (nHintSeg == 0) {
                        if (piVar24[0x16] == 0) {
                          piVar24[0x16] = 1;
                          **(undefined1 **)(piVar24 + 0x14) = 0;
                        }
                        iVar6 = fts3AppendToNode(local_70,local_48,local_130,(int)local_98,
                                                 (char *)piVar23,(int)local_88);
                        in_R8 = piVar23;
                        if (iVar6 == 0) {
                          iVar6 = sqlite3Fts3SegReaderStep(p,local_a0);
                          in_R8 = piVar23;
                        }
                      }
                      uVar16 = piVar24[1];
                      piVar18 = (int *)(ulong)uVar16;
                      if ((local_ec <= (int)uVar16) && (iVar6 == 100)) goto LAB_001ab8b3;
                    } while (iVar6 == 100);
                    local_184 = iVar6;
                    if (iVar6 != 0) goto LAB_001ab435;
LAB_001ab8b3:
                    local_184 = 0;
                    local_128 = (sqlite3_stmt *)CONCAT44(local_128._4_4_,~uVar16);
                    iVar6 = piVar24[0xb6];
                    iVar20 = 0;
                    local_160 = (char *)((ulong)local_160 & 0xffffffff00000000);
                    while ((0 < iVar6 && (iVar20 == 0))) {
                      iVar6 = iVar6 + -1;
                      uVar26 = (ulong)(uint)piVar24[0xb6];
                      if (piVar24[0xb6] < 1) {
                        uVar26 = 0;
                      }
                      uVar29 = 0;
                      pSeg = (Fts3SegReader *)0x0;
                      do {
                        if (uVar26 == uVar29) break;
                        pSeg = local_a0->apSegment[uVar29];
                        uVar29 = uVar29 + 1;
                      } while (pSeg->iIdx != iVar6);
                      if (pSeg->aNode == (char *)0x0) {
                        iVar20 = fts3DeleteSegment(p,pSeg);
                        if (iVar20 == 0) {
                          iVar7 = pSeg->iIdx;
                          pSelect = (sqlite3_stmt *)0x0;
                          iVar20 = fts3SqlStmt(p,0x1e,&pSelect,(sqlite3_value **)0x0);
                          psVar25 = pSelect;
                          piVar24 = local_180;
                          if (iVar20 == 0) {
                            sqlite3_bind_int64(pSelect,1,(sqlite_int64)local_170);
                            sqlite3_bind_int(psVar25,2,iVar7);
                            sqlite3_step(psVar25);
                            iVar20 = sqlite3_reset(psVar25);
                            piVar24 = local_180;
                          }
                        }
                      }
                      else {
                        local_110 = pSeg->zTerm;
                        iVar7 = pSeg->iIdx;
                        uVar16 = pSeg->nTerm;
                        pSelect = (sqlite3_stmt *)0x0;
                        uStack_e0._0_4_ = 0;
                        uStack_e0._4_4_ = 0;
                        iEnd = 0;
                        _nHintSeg = (sqlite3_stmt *)0x0;
                        uStack_150._0_4_ = 0;
                        uStack_150._4_4_ = 0;
                        aLeaf = (char *)0x0;
                        iVar20 = fts3SqlStmt(p,0x20,(sqlite3_stmt **)&aLeaf,(sqlite3_value **)0x0);
                        pcVar28 = aLeaf;
                        local_130 = (char *)0x0;
                        if (iVar20 == 0) {
                          sqlite3_bind_int64((sqlite3_stmt *)aLeaf,1,(sqlite_int64)local_170);
                          local_140 = (char *)CONCAT44(local_140._4_4_,iVar7);
                          sqlite3_bind_int((sqlite3_stmt *)pcVar28,2,iVar7);
                          iVar20 = sqlite3_step((sqlite3_stmt *)pcVar28);
                          if (iVar20 == 100) {
                            pcVar12 = (char *)sqlite3_column_blob((sqlite3_stmt *)pcVar28,4);
                            iVar20 = sqlite3_column_bytes((sqlite3_stmt *)pcVar28,4);
                            local_130 = (char *)sqlite3_column_int64((sqlite3_stmt *)pcVar28,1);
                            in_R8 = (int *)(ulong)uVar16;
                            iVar7 = fts3TruncateNode(pcVar12,iVar20,(Blob *)&pSelect,local_110,
                                                     uVar16,&iEnd);
                          }
                          else {
                            local_130 = (char *)0x0;
                            iVar7 = 0;
                          }
                          iVar20 = sqlite3_reset((sqlite3_stmt *)pcVar28);
                          if (iVar7 != 0) {
                            iVar20 = iVar7;
                          }
                          iVar7 = (int)local_140;
                        }
                        lVar22 = 0;
                        while ((sVar14 = iEnd, piVar24 = local_180, iVar20 == 0 && (iEnd != 0))) {
                          aBlock_1 = (char *)0x0;
                          nLeaf = 0;
                          iVar20 = sqlite3Fts3ReadBlock(p,iEnd,&aBlock_1,&nLeaf,in_R8);
                          if (iVar20 == 0) {
                            in_R8 = (int *)(ulong)uVar16;
                            iVar20 = fts3TruncateNode(aBlock_1,nLeaf,(Blob *)&nHintSeg,local_110,
                                                      uVar16,&iEnd);
                            if (iVar20 == 0) {
                              iVar20 = fts3WriteSegment(p,sVar14,(char *)_nHintSeg,(int)uStack_150);
                            }
                          }
                          sqlite3_free(aBlock_1);
                          lVar22 = sVar14;
                        }
                        if ((lVar22 != 0) && (iVar20 == 0)) {
                          aBlock_1 = (char *)0x0;
                          iVar20 = fts3SqlStmt(p,0x11,(sqlite3_stmt **)&aBlock_1,
                                               (sqlite3_value **)0x0);
                          pcVar28 = aBlock_1;
                          if (iVar20 == 0) {
                            sqlite3_bind_int64((sqlite3_stmt *)aBlock_1,1,(sqlite_int64)local_130);
                            sqlite3_bind_int64((sqlite3_stmt *)pcVar28,2,lVar22 + -1);
                            sqlite3_step((sqlite3_stmt *)pcVar28);
                            iVar20 = sqlite3_reset((sqlite3_stmt *)pcVar28);
                          }
                        }
                        if (iVar20 == 0) {
                          aBlock_1 = (char *)0x0;
                          iVar20 = fts3SqlStmt(p,0x21,(sqlite3_stmt **)&aBlock_1,
                                               (sqlite3_value **)0x0);
                          pcVar28 = aBlock_1;
                          if (iVar20 == 0) {
                            sqlite3_bind_int64((sqlite3_stmt *)aBlock_1,1,lVar22);
                            in_R8 = (int *)0x0;
                            sqlite3_bind_blob((sqlite3_stmt *)pcVar28,2,pSelect,(int)uStack_e0,
                                              (_func_void_void_ptr *)0x0);
                            sqlite3_bind_int64((sqlite3_stmt *)pcVar28,3,(sqlite_int64)local_170);
                            sqlite3_bind_int((sqlite3_stmt *)pcVar28,4,iVar7);
                            sqlite3_step((sqlite3_stmt *)pcVar28);
                            iVar20 = sqlite3_reset((sqlite3_stmt *)pcVar28);
                            sqlite3_bind_null((sqlite3_stmt *)pcVar28,2);
                          }
                        }
                        sqlite3_free(pSelect);
                        sqlite3_free(_nHintSeg);
                        local_160 = (char *)CONCAT44(local_160._4_4_,(int)local_160 + 1);
                      }
                    }
                    if (iVar20 == 0) {
                      iVar20 = 0;
                      if ((int)local_160 != piVar24[0xb6]) {
                        pSelect = (sqlite3_stmt *)0x0;
                        _nHintSeg = (sqlite3_stmt *)0x0;
                        iVar20 = fts3SqlStmt(p,0x23,&pSelect,(sqlite3_value **)0x0);
                        psVar25 = pSelect;
                        if (iVar20 == 0) {
                          sqlite3_bind_int64(pSelect,1,(sqlite_int64)local_170);
                          iVar6 = 0;
                          uVar26 = 0;
                          iVar20 = 0;
                          pvVar11 = (void *)0x0;
                          while (iVar7 = sqlite3_step(psVar25), iVar7 == 100) {
                            pvVar15 = pvVar11;
                            if ((long)iVar20 <= (long)uVar26) {
                              pvVar15 = sqlite3_realloc(pvVar11,iVar20 * 4 + 0x40);
                              if (pvVar15 == (void *)0x0) {
                                iVar6 = 7;
                                break;
                              }
                              iVar20 = iVar20 + 0x10;
                            }
                            iVar7 = sqlite3_column_int(psVar25,0);
                            *(int *)((long)pvVar15 + uVar26 * 4) = iVar7;
                            uVar26 = uVar26 + 1;
                            pvVar11 = pvVar15;
                          }
                          iVar20 = sqlite3_reset(psVar25);
                          if (iVar7 == 100) {
                            iVar20 = iVar6;
                          }
                          psVar25 = _nHintSeg;
                          if ((iVar20 == 0) &&
                             (iVar20 = fts3SqlStmt(p,0x1f,(sqlite3_stmt **)&nHintSeg,
                                                   (sqlite3_value **)0x0), psVar25 = _nHintSeg,
                             iVar20 == 0)) {
                            sqlite3_bind_int64(_nHintSeg,2,(sqlite_int64)local_170);
                            iVar20 = 0;
                          }
                        }
                        else {
                          uVar26 = 0;
                          pvVar11 = (void *)0x0;
                          psVar25 = (sqlite3_stmt *)0x0;
                        }
                        p->bIgnoreSavepoint = '\x01';
                        for (uVar29 = 0; (iVar20 == 0 && (uVar29 < (uVar26 & 0xffffffff)));
                            uVar29 = uVar29 + 1) {
                          uVar16 = *(uint *)((long)pvVar11 + uVar29 * 4);
                          iVar20 = 0;
                          if (uVar29 != uVar16) {
                            sqlite3_bind_int(psVar25,3,uVar16);
                            sqlite3_bind_int(psVar25,1,(int)uVar29);
                            sqlite3_step(psVar25);
                            iVar20 = sqlite3_reset(psVar25);
                          }
                        }
                        p->bIgnoreSavepoint = '\0';
                        sqlite3_free(pvVar11);
                      }
                    }
                    local_184 = iVar20;
                    local_ec = local_ec + (int)local_128;
                    iVar6 = local_184;
                    if ((int)local_160 != 0) {
                      blobGrowBuffer(&local_108,local_108.n + 0x14,&local_184);
                      pcVar28 = local_108.a;
                      iVar20 = 1;
                      iVar6 = local_184;
                      if (local_184 == 0) {
                        lVar22 = (long)local_108.n;
                        iVar6 = sqlite3Fts3PutVarint(local_108.a + lVar22,(sqlite_int64)local_170);
                        lVar22 = iVar6 + lVar22;
                        iVar6 = sqlite3Fts3PutVarint(pcVar28 + lVar22,(ulong)local_160 & 0xffffffff)
                        ;
                        local_108.n = iVar6 + (int)lVar22;
                        iVar20 = 1;
                        iVar6 = 0;
                      }
                      goto LAB_001ab43d;
                    }
                  }
                  else {
LAB_001ab435:
                    iVar20 = local_114;
                    if ((int)local_110 != 0) {
LAB_001ab43d:
                      local_114 = iVar20;
                      *local_b0 = -*local_b0;
                      bVar31 = false;
                      goto LAB_001abea1;
                    }
                  }
                  bVar31 = true;
LAB_001abea1:
                  pSelect = (sqlite3_stmt *)CONCAT44(pSelect._4_4_,iVar6);
                  uVar26 = 0xf;
LAB_001abeac:
                  piVar18 = local_138;
                  iVar20 = (int)uVar26;
                  piVar24 = local_180;
                  if (-1 < iVar20) {
                    if (local_138[uVar26 * 10 + 8] < 1) goto code_r0x001abec3;
                    if (iVar20 == 0) {
                      blobGrowBuffer(local_78,0xb,(int *)&pSelect);
                      piVar24 = local_180;
                      uVar26 = 1;
                      iVar6 = (int)pSelect;
                      if ((int)pSelect == 0) {
                        **(undefined1 **)(local_180 + 0x1e) = 1;
                        iVar6 = sqlite3Fts3PutVarint
                                          ((char *)(*(long *)(local_180 + 0x1e) + 1),
                                           *(sqlite_int64 *)(local_180 + 0xe));
                        piVar24[0x20] = iVar6 + 1;
                        iVar6 = 0;
                        uVar26 = 1;
                      }
                    }
                    piVar24 = local_180;
                    for (lVar22 = 0; piVar18 = local_138, uVar26 * 0x28 - lVar22 != 0;
                        lVar22 = lVar22 + 0x28) {
                      iVar20 = *(int *)((long)piVar24 + lVar22 + 0x58);
                      if ((0 < iVar20) && (iVar6 == 0)) {
                        iVar6 = fts3WriteSegment(p,*(sqlite3_int64 *)((long)piVar24 + lVar22 + 0x38)
                                                 ,*(char **)((long)piVar24 + lVar22 + 0x50),iVar20);
                      }
                      sqlite3_free(*(void **)((long)piVar24 + lVar22 + 0x50));
                      sqlite3_free(*(void **)((long)piVar24 + lVar22 + 0x40));
                    }
                    if (iVar6 == 0) {
                      if ((char)piVar24[0xc] == '\0') {
                        lVar22 = *local_b0;
                      }
                      else {
                        lVar22 = 0;
                      }
                      in_R8 = *(int **)(piVar24 + 0xe);
                      iVar6 = fts3WriteSegdir(p,*(long *)(piVar24 + 2) + 1,piVar24[4],
                                              *(sqlite3_int64 *)(piVar24 + 6),(sqlite3_int64)in_R8,
                                              *(sqlite3_int64 *)(piVar24 + 8),lVar22,
                                              *(char **)(local_138 + uVar26 * 10 + 6),
                                              local_138[uVar26 * 10 + 8]);
                    }
                    sqlite3_free(*(void **)(piVar18 + uVar26 * 10 + 6));
                    sqlite3_free(*(void **)(piVar18 + uVar26 * 10 + 2));
                    local_184 = iVar6;
                  }
                  iVar20 = local_184;
                  if ((bVar31) && ((char)piVar24[0xc] == '\0')) {
                    fts3PromoteSegments(p,(sqlite3_int64)(local_170 + 1),*local_b0);
                    iVar20 = local_184;
                  }
                }
              }
            }
          }
        }
      }
LAB_001aacd0:
      local_184 = iVar20;
      sqlite3Fts3SegReaderFinish(local_a0);
    }
    if ((local_114 != 0) && (iVar6 == 0)) {
      pSelect = (sqlite3_stmt *)0x0;
      iVar6 = fts3SqlStmt(p,0x17,&pSelect,(sqlite3_value **)0x0);
      psVar25 = pSelect;
      if (iVar6 == 0) {
        sqlite3_bind_int64(pSelect,1,1);
        sqlite3_bind_blob(psVar25,2,local_108.a,local_108.n,(_func_void_void_ptr *)0x0);
        sqlite3_step(psVar25);
        iVar6 = sqlite3_reset(psVar25);
        sqlite3_bind_null(psVar25,2);
      }
    }
    sqlite3_free(piVar24);
    sqlite3_free(local_108.a);
  }
  return iVar6;
code_r0x001abec3:
  sqlite3_free(*(void **)(local_138 + uVar26 * 10 + 6));
  sqlite3_free(*(void **)(piVar18 + uVar26 * 10 + 2));
  uVar26 = (ulong)(iVar20 - 1);
  goto LAB_001abeac;
}

Assistant:

SQLITE_PRIVATE int sqlite3Fts3Incrmerge(Fts3Table *p, int nMerge, int nMin){
  int rc;                         /* Return code */
  int nRem = nMerge;              /* Number of leaf pages yet to  be written */
  Fts3MultiSegReader *pCsr;       /* Cursor used to read input data */
  Fts3SegFilter *pFilter;         /* Filter used with cursor pCsr */
  IncrmergeWriter *pWriter;       /* Writer object */
  int nSeg = 0;                   /* Number of input segments */
  sqlite3_int64 iAbsLevel = 0;    /* Absolute level number to work on */
  Blob hint = {0, 0, 0};          /* Hint read from %_stat table */
  int bDirtyHint = 0;             /* True if blob 'hint' has been modified */

  /* Allocate space for the cursor, filter and writer objects */
  const int nAlloc = sizeof(*pCsr) + sizeof(*pFilter) + sizeof(*pWriter);
  pWriter = (IncrmergeWriter *)sqlite3_malloc(nAlloc);
  if( !pWriter ) return SQLITE_NOMEM;
  pFilter = (Fts3SegFilter *)&pWriter[1];
  pCsr = (Fts3MultiSegReader *)&pFilter[1];

  rc = fts3IncrmergeHintLoad(p, &hint);
  while( rc==SQLITE_OK && nRem>0 ){
    const i64 nMod = FTS3_SEGDIR_MAXLEVEL * p->nIndex;
    sqlite3_stmt *pFindLevel = 0; /* SQL used to determine iAbsLevel */
    int bUseHint = 0;             /* True if attempting to append */
    int iIdx = 0;                 /* Largest idx in level (iAbsLevel+1) */

    /* Search the %_segdir table for the absolute level with the smallest
    ** relative level number that contains at least nMin segments, if any.
    ** If one is found, set iAbsLevel to the absolute level number and
    ** nSeg to nMin. If no level with at least nMin segments can be found, 
    ** set nSeg to -1.
    */
    rc = fts3SqlStmt(p, SQL_FIND_MERGE_LEVEL, &pFindLevel, 0);
    sqlite3_bind_int(pFindLevel, 1, MAX(2, nMin));
    if( sqlite3_step(pFindLevel)==SQLITE_ROW ){
      iAbsLevel = sqlite3_column_int64(pFindLevel, 0);
      nSeg = sqlite3_column_int(pFindLevel, 1);
      assert( nSeg>=2 );
    }else{
      nSeg = -1;
    }
    rc = sqlite3_reset(pFindLevel);

    /* If the hint read from the %_stat table is not empty, check if the
    ** last entry in it specifies a relative level smaller than or equal
    ** to the level identified by the block above (if any). If so, this 
    ** iteration of the loop will work on merging at the hinted level.
    */
    if( rc==SQLITE_OK && hint.n ){
      int nHint = hint.n;
      sqlite3_int64 iHintAbsLevel = 0;      /* Hint level */
      int nHintSeg = 0;                     /* Hint number of segments */

      rc = fts3IncrmergeHintPop(&hint, &iHintAbsLevel, &nHintSeg);
      if( nSeg<0 || (iAbsLevel % nMod) >= (iHintAbsLevel % nMod) ){
        iAbsLevel = iHintAbsLevel;
        nSeg = nHintSeg;
        bUseHint = 1;
        bDirtyHint = 1;
      }else{
        /* This undoes the effect of the HintPop() above - so that no entry
        ** is removed from the hint blob.  */
        hint.n = nHint;
      }
    }

    /* If nSeg is less that zero, then there is no level with at least
    ** nMin segments and no hint in the %_stat table. No work to do.
    ** Exit early in this case.  */
    if( nSeg<0 ) break;

    /* Open a cursor to iterate through the contents of the oldest nSeg 
    ** indexes of absolute level iAbsLevel. If this cursor is opened using 
    ** the 'hint' parameters, it is possible that there are less than nSeg
    ** segments available in level iAbsLevel. In this case, no work is
    ** done on iAbsLevel - fall through to the next iteration of the loop 
    ** to start work on some other level.  */
    memset(pWriter, 0, nAlloc);
    pFilter->flags = FTS3_SEGMENT_REQUIRE_POS;

    if( rc==SQLITE_OK ){
      rc = fts3IncrmergeOutputIdx(p, iAbsLevel, &iIdx);
      assert( bUseHint==1 || bUseHint==0 );
      if( iIdx==0 || (bUseHint && iIdx==1) ){
        int bIgnore = 0;
        rc = fts3SegmentIsMaxLevel(p, iAbsLevel+1, &bIgnore);
        if( bIgnore ){
          pFilter->flags |= FTS3_SEGMENT_IGNORE_EMPTY;
        }
      }
    }

    if( rc==SQLITE_OK ){
      rc = fts3IncrmergeCsr(p, iAbsLevel, nSeg, pCsr);
    }
    if( SQLITE_OK==rc && pCsr->nSegment==nSeg
     && SQLITE_OK==(rc = sqlite3Fts3SegReaderStart(p, pCsr, pFilter))
     && SQLITE_ROW==(rc = sqlite3Fts3SegReaderStep(p, pCsr))
    ){
      if( bUseHint && iIdx>0 ){
        const char *zKey = pCsr->zTerm;
        int nKey = pCsr->nTerm;
        rc = fts3IncrmergeLoad(p, iAbsLevel, iIdx-1, zKey, nKey, pWriter);
      }else{
        rc = fts3IncrmergeWriter(p, iAbsLevel, iIdx, pCsr, pWriter);
      }

      if( rc==SQLITE_OK && pWriter->nLeafEst ){
        fts3LogMerge(nSeg, iAbsLevel);
        do {
          rc = fts3IncrmergeAppend(p, pWriter, pCsr);
          if( rc==SQLITE_OK ) rc = sqlite3Fts3SegReaderStep(p, pCsr);
          if( pWriter->nWork>=nRem && rc==SQLITE_ROW ) rc = SQLITE_OK;
        }while( rc==SQLITE_ROW );

        /* Update or delete the input segments */
        if( rc==SQLITE_OK ){
          nRem -= (1 + pWriter->nWork);
          rc = fts3IncrmergeChomp(p, iAbsLevel, pCsr, &nSeg);
          if( nSeg!=0 ){
            bDirtyHint = 1;
            fts3IncrmergeHintPush(&hint, iAbsLevel, nSeg, &rc);
          }
        }
      }

      if( nSeg!=0 ){
        pWriter->nLeafData = pWriter->nLeafData * -1;
      }
      fts3IncrmergeRelease(p, pWriter, &rc);
      if( nSeg==0 && pWriter->bNoLeafData==0 ){
        fts3PromoteSegments(p, iAbsLevel+1, pWriter->nLeafData);
      }
    }

    sqlite3Fts3SegReaderFinish(pCsr);
  }

  /* Write the hint values into the %_stat table for the next incr-merger */
  if( bDirtyHint && rc==SQLITE_OK ){
    rc = fts3IncrmergeHintStore(p, &hint);
  }

  sqlite3_free(pWriter);
  sqlite3_free(hint.a);
  return rc;
}